

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

void __thiscall QList<QString>::append(QList<QString> *this,QList<QString> *other)

{
  long n;
  Data *pDVar1;
  QString *b;
  
  n = (other->d).size;
  if (n == 0) {
    return;
  }
  pDVar1 = (other->d).d;
  if ((pDVar1 != (Data *)0x0) &&
     ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) {
    QArrayDataPointer<QString>::detachAndGrow
              (&this->d,GrowsAtEnd,n,(QString **)0x0,(QArrayDataPointer<QString> *)0x0);
    b = (other->d).ptr;
    QtPrivate::QGenericArrayOps<QString>::moveAppend
              ((QGenericArrayOps<QString> *)this,b,b + (other->d).size);
    return;
  }
  append(this,other);
  return;
}

Assistant:

constexpr qsizetype size() const noexcept
    {
#if __has_cpp_attribute(assume)
        constexpr size_t MaxSize = maxSize();
        [[assume(size_t(d.size) <= MaxSize)]];
#endif
        return d.size;
    }